

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb3Image.c
# Opt level: O3

void Llb_NonlinAddPartition(Llb_Mgr_t *p,int i,DdNode *bFunc)

{
  int iVar1;
  Llb_Prt_t **ppLVar2;
  int iVar3;
  Llb_Prt_t *pLVar4;
  Vec_Int_t *pVVar5;
  int *piVar6;
  long lVar7;
  int iVar8;
  
  if (*(int *)((ulong)bFunc & 0xfffffffffffffffe) == 0x7fffffff) {
    __assert_fail("!Cudd_IsConstant(bFunc)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb3Image.c"
                  ,0x277,"void Llb_NonlinAddPartition(Llb_Mgr_t *, int, DdNode *)");
  }
  pLVar4 = (Llb_Prt_t *)calloc(1,0x18);
  p->pParts[i] = pLVar4;
  ppLVar2 = p->pParts;
  pLVar4 = ppLVar2[i];
  pLVar4->iPart = i;
  pLVar4->bFunc = bFunc;
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  pVVar5->nCap = 0x10;
  pVVar5->nSize = 0;
  piVar6 = (int *)malloc(0x40);
  pVVar5->pArray = piVar6;
  ppLVar2[i]->vVars = pVVar5;
  Extra_SupportArray(p->dd,bFunc,p->pSupp);
  iVar3 = p->nVars;
  if (iVar3 < 1) {
    iVar8 = 0;
  }
  else {
    lVar7 = 0;
    iVar8 = 0;
    do {
      iVar1 = p->pSupp[lVar7];
      if ((iVar1 != 0) && (p->pVars2Q[lVar7] != 0)) {
        Llb_NonlinAddPair(p,bFunc,i,(int)lVar7);
        iVar3 = p->nVars;
      }
      iVar8 = iVar8 + iVar1;
      lVar7 = lVar7 + 1;
    } while (lVar7 < iVar3);
  }
  if (iVar8 < p->nSuppMax) {
    iVar8 = p->nSuppMax;
  }
  p->nSuppMax = iVar8;
  return;
}

Assistant:

void Llb_NonlinAddPartition( Llb_Mgr_t * p, int i, DdNode * bFunc )
{
    int k, nSuppSize;
    assert( !Cudd_IsConstant(bFunc) );
    // create partition
    p->pParts[i] = ABC_CALLOC( Llb_Prt_t, 1 );
    p->pParts[i]->iPart = i;
    p->pParts[i]->bFunc = bFunc;
    p->pParts[i]->vVars = Vec_IntAlloc( 8 );
    // add support dependencies
    nSuppSize = 0;
    Extra_SupportArray( p->dd, bFunc, p->pSupp );
    for ( k = 0; k < p->nVars; k++ )
    {
        nSuppSize += p->pSupp[k];
        if ( p->pSupp[k] && p->pVars2Q[k] )
            Llb_NonlinAddPair( p, bFunc, i, k );
    }
    p->nSuppMax = Abc_MaxInt( p->nSuppMax, nSuppSize ); 
}